

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_unittest.cc
# Opt level: O3

void Test_Demangle_Clones::RunTest(void)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  istream *piVar4;
  long lVar5;
  undefined8 extraout_RAX;
  char tmp [20];
  char *pcStack_2d0;
  long lStack_2c8;
  char acStack_2c0 [16];
  char *apcStack_2b0 [2];
  char acStack_2a0 [16];
  char *apcStack_290 [2];
  char acStack_280 [16];
  undefined1 *apuStack_270 [2];
  undefined1 auStack_260 [16];
  long alStack_250 [4];
  byte abStack_230 [488];
  int local_18;
  short local_14;
  
  bVar1 = google::Demangle("_ZL3Foov",(char *)&local_18,0x14);
  if (bVar1) {
    if (local_14 != 0x29 || local_18 != 0x286f6f46) goto LAB_001092d8;
    bVar1 = google::Demangle("_ZL3Foov.clone.3",(char *)&local_18,0x14);
    if (!bVar1) goto LAB_001092dd;
    if (local_14 != 0x29 || local_18 != 0x286f6f46) goto LAB_001092e2;
    bVar1 = google::Demangle("_ZL3Foov.constprop.80",(char *)&local_18,0x14);
    if (!bVar1) goto LAB_001092e7;
    if (local_14 != 0x29 || local_18 != 0x286f6f46) goto LAB_001092ec;
    bVar1 = google::Demangle("_ZL3Foov.isra.18",(char *)&local_18,0x14);
    if (!bVar1) goto LAB_001092f1;
    if (local_14 != 0x29 || local_18 != 0x286f6f46) goto LAB_001092f6;
    bVar1 = google::Demangle("_ZL3Foov.isra.2.constprop.18",(char *)&local_18,0x14);
    if (!bVar1) goto LAB_001092fb;
    if (local_14 != 0x29 || local_18 != 0x286f6f46) goto LAB_00109300;
    bVar1 = google::Demangle("_ZL3Foov.clo",(char *)&local_18,0x14);
    if (bVar1) goto LAB_00109305;
    bVar1 = google::Demangle("_ZL3Foov.clone.",(char *)&local_18,0x14);
    if (bVar1) goto LAB_0010930a;
    bVar1 = google::Demangle("_ZL3Foov.clone.foo",(char *)&local_18,0x14);
    if (!bVar1) {
      bVar1 = google::Demangle("_ZL3Foov.isra.2.constprop.",(char *)&local_18,0x14);
      if (!bVar1) {
        return;
      }
      goto LAB_00109314;
    }
  }
  else {
    RunTest();
LAB_001092d8:
    RunTest();
LAB_001092dd:
    RunTest();
LAB_001092e2:
    RunTest();
LAB_001092e7:
    RunTest();
LAB_001092ec:
    RunTest();
LAB_001092f1:
    RunTest();
LAB_001092f6:
    RunTest();
LAB_001092fb:
    RunTest();
LAB_00109300:
    RunTest();
LAB_00109305:
    RunTest();
LAB_0010930a:
    RunTest();
  }
  RunTest();
LAB_00109314:
  RunTest();
  apcStack_2b0[0] = acStack_2a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)apcStack_2b0,fLS::FLAGS_test_srcdir_buf_abi_cxx11_,
             DAT_001309b8 + fLS::FLAGS_test_srcdir_buf_abi_cxx11_);
  std::__cxx11::string::append((char *)apcStack_2b0);
  std::ifstream::ifstream((istream *)alStack_250,apcStack_2b0[0],_S_in);
  if ((abStack_230[*(long *)(alStack_250[0] + -0x18)] & 5) == 0) {
    pcStack_2d0 = acStack_2c0;
    lStack_2c8 = 0;
    acStack_2c0[0] = '\0';
    while( true ) {
      do {
        cVar2 = std::ios::widen((char)*(undefined8 *)(alStack_250[0] + -0x18) +
                                (char)(istream *)alStack_250);
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)alStack_250,(string *)&pcStack_2d0,cVar2);
        if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
          if (pcStack_2d0 != acStack_2c0) {
            free(pcStack_2d0);
          }
          std::ifstream::~ifstream(alStack_250);
          if (apcStack_2b0[0] != acStack_2a0) {
            free(apcStack_2b0[0]);
          }
          return;
        }
      } while ((lStack_2c8 == 0) || (*pcStack_2d0 == '#'));
      lVar5 = std::__cxx11::string::find((char)&pcStack_2d0,9);
      if (lVar5 == -1) break;
      std::__cxx11::string::substr((ulong)apcStack_290,(ulong)&pcStack_2d0);
      std::__cxx11::string::substr((ulong)apuStack_270,(ulong)&pcStack_2d0);
      google::Demangle(apcStack_290[0],DemangleIt(char_const*)::demangled,0x1000);
      iVar3 = std::__cxx11::string::compare((char *)apuStack_270);
      if (iVar3 != 0) goto LAB_001094f9;
      if (apuStack_270[0] != auStack_260) {
        free(apuStack_270[0]);
      }
      if (apcStack_290[0] != acStack_280) {
        free(apcStack_290[0]);
      }
    }
    Test_Demangle_FromFile::RunTest();
LAB_001094f9:
    Test_Demangle_FromFile::RunTest();
  }
  Test_Demangle_FromFile::RunTest();
  if (apcStack_2b0[0] != acStack_2a0) {
    free(apcStack_2b0[0]);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(Demangle, Clones) {
  char tmp[20];
  EXPECT_TRUE(Demangle("_ZL3Foov", tmp, sizeof(tmp)));
  EXPECT_STREQ("Foo()", tmp);
  EXPECT_TRUE(Demangle("_ZL3Foov.clone.3", tmp, sizeof(tmp)));
  EXPECT_STREQ("Foo()", tmp);
  EXPECT_TRUE(Demangle("_ZL3Foov.constprop.80", tmp, sizeof(tmp)));
  EXPECT_STREQ("Foo()", tmp);
  EXPECT_TRUE(Demangle("_ZL3Foov.isra.18", tmp, sizeof(tmp)));
  EXPECT_STREQ("Foo()", tmp);
  EXPECT_TRUE(Demangle("_ZL3Foov.isra.2.constprop.18", tmp, sizeof(tmp)));
  EXPECT_STREQ("Foo()", tmp);
  // Invalid (truncated), should not demangle.
  EXPECT_FALSE(Demangle("_ZL3Foov.clo", tmp, sizeof(tmp)));
  // Invalid (.clone. not followed by number), should not demangle.
  EXPECT_FALSE(Demangle("_ZL3Foov.clone.", tmp, sizeof(tmp)));
  // Invalid (.clone. followed by non-number), should not demangle.
  EXPECT_FALSE(Demangle("_ZL3Foov.clone.foo", tmp, sizeof(tmp)));
  // Invalid (.constprop. not followed by number), should not demangle.
  EXPECT_FALSE(Demangle("_ZL3Foov.isra.2.constprop.", tmp, sizeof(tmp)));
}